

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  string *psVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  EnumValueDescriptor *this_00;
  EnumValueDescriptorProto *proto_00;
  EnumDescriptorProto_EnumReservedRange *this_01;
  ReservedRange *pRVar5;
  EnumOptions *pEVar6;
  EnumOptions *pEVar7;
  int local_3c;
  int i_2;
  EnumReservedRange *range;
  int i_1;
  int i;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *this_local;
  
  psVar2 = name_abi_cxx11_(this);
  puVar3 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
  *puVar3 = *puVar3 | 1;
  pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
  internal::ArenaStringPtr::Set(&proto->name_,psVar2,pAVar4);
  range._4_4_ = 0;
  while( true ) {
    iVar1 = value_count(this);
    if (iVar1 <= range._4_4_) break;
    this_00 = value(this,range._4_4_);
    proto_00 = EnumDescriptorProto::add_value(proto);
    EnumValueDescriptor::CopyTo(this_00,proto_00);
    range._4_4_ = range._4_4_ + 1;
  }
  range._0_4_ = 0;
  while( true ) {
    iVar1 = reserved_range_count(this);
    if (iVar1 <= (int)range) break;
    this_01 = EnumDescriptorProto::add_reserved_range(proto);
    pRVar5 = reserved_range(this,(int)range);
    EnumDescriptorProto_EnumReservedRange::set_start(this_01,pRVar5->start);
    pRVar5 = reserved_range(this,(int)range);
    EnumDescriptorProto_EnumReservedRange::set_end(this_01,pRVar5->end);
    range._0_4_ = (int)range + 1;
  }
  local_3c = 0;
  while( true ) {
    iVar1 = reserved_name_count(this);
    if (iVar1 <= local_3c) break;
    psVar2 = reserved_name_abi_cxx11_(this,local_3c);
    EnumDescriptorProto::add_reserved_name(proto,psVar2);
    local_3c = local_3c + 1;
  }
  pEVar6 = options(this);
  pEVar7 = EnumOptions::default_instance();
  if (pEVar6 != pEVar7) {
    pEVar6 = EnumDescriptorProto::mutable_options(proto);
    pEVar7 = options(this);
    EnumOptions::CopyFrom(pEVar6,pEVar7);
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}